

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,i64 n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *psVar4;
  Parse *pPVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  size_t sVar9;
  u8 uVar10;
  u16 uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar15;
  long lVar14;
  
  if (z == (char *)0x0) {
    if ((pMem->flags & 0x9000) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    return 0;
  }
  psVar4 = pMem->db;
  if (psVar4 == (sqlite3 *)0x0) {
    uVar12 = 1000000000;
  }
  else {
    uVar12 = (ulong)psVar4->aLimit[0];
  }
  bVar8 = enc;
  if (n < 0) {
    if (enc == '\x01') {
      sVar9 = strlen(z);
      uVar11 = 0x202;
    }
    else {
      uVar11 = 0x202;
      if ((long)uVar12 < 0) {
        sVar9 = 0;
      }
      else {
        sVar13 = 0;
        do {
          sVar9 = sVar13;
          if (z[sVar13 + 1] == '\0' && z[sVar13] == '\0') break;
          sVar13 = sVar13 + 2;
          sVar9 = (uVar12 & 0x7ffffffffffffffe) + 2;
        } while ((long)sVar13 <= (long)uVar12);
      }
    }
  }
  else {
    bVar8 = 1;
    if (1 < enc) {
      bVar8 = enc;
    }
    uVar11 = 2;
    sVar9 = n;
    if (enc == '\0') {
      uVar11 = 0x10;
    }
  }
  if ((long)uVar12 < (long)sVar9) {
    if ((code *)0x1 < xDel + 1) {
      if (xDel == sqlite3OomClear) {
        sqlite3DbFreeNN(psVar4,z);
      }
      else {
        (*xDel)(z);
      }
    }
    if ((pMem->flags & 0x9000) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    if (pMem->db == (sqlite3 *)0x0) {
      return 0x12;
    }
    pPVar5 = pMem->db->pParse;
    if (pPVar5 == (Parse *)0x0) {
      return 0x12;
    }
    pPVar5->rc = 0x12;
    pPVar5->nErr = pPVar5->nErr + 1;
    return 0x12;
  }
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    lVar14 = 0;
    if (n < 0) {
      lVar14 = (ulong)(bVar8 != 1) + 1;
    }
    sVar13 = lVar14 + sVar9;
    iVar6 = 0x20;
    if (0x20 < (long)sVar13) {
      iVar6 = (int)sVar13;
    }
    if (pMem->szMalloc < iVar6) {
      iVar6 = sqlite3VdbeMemGrow(pMem,iVar6,0);
      if (iVar6 != 0) {
        return 7;
      }
    }
    else {
      pMem->z = pMem->zMalloc;
      pMem->flags = pMem->flags & 0x2d;
    }
    memcpy(pMem->z,z,sVar13);
    goto LAB_0011b92d;
  }
  if (((pMem->flags & 0x9000) != 0) || (pMem->szMalloc != 0)) {
    vdbeMemClear(pMem);
  }
  pMem->z = z;
  if (xDel != sqlite3OomClear) {
    pMem->xDel = xDel;
    uVar11 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x1000 + uVar11 + 0x1000;
    goto LAB_0011b92d;
  }
  pMem->zMalloc = z;
  psVar4 = pMem->db;
  if ((psVar4 == (sqlite3 *)0x0) || ((psVar4->lookaside).pEnd <= z)) {
LAB_0011b8ff:
    uVar15 = (*sqlite3Config.m.xSize)(z);
  }
  else {
    uVar15 = 0x80;
    if (z < (psVar4->lookaside).pMiddle) {
      if (z < (psVar4->lookaside).pStart) goto LAB_0011b8ff;
      uVar15 = (uint)(psVar4->lookaside).szTrue;
    }
  }
  pMem->szMalloc = uVar15;
LAB_0011b92d:
  uVar15 = (uint)sVar9 & 0x7fffffff;
  pMem->n = uVar15;
  pMem->flags = uVar11;
  pMem->enc = bVar8;
  iVar6 = 0;
  if (1 < bVar8) {
    iVar6 = 0;
    uVar10 = '\0';
    if (1 < uVar15) {
      cVar2 = *pMem->z;
      cVar3 = pMem->z[1];
      uVar10 = '\x02';
      if (cVar3 != -2 || cVar2 != -1) {
        uVar10 = (cVar3 == -1 && cVar2 == -2) * '\x03';
      }
    }
    if (uVar10 != '\0') {
      iVar7 = sqlite3VdbeMemMakeWriteable(pMem);
      iVar6 = 7;
      if (iVar7 == 0) {
        sVar9 = (long)pMem->n - 2;
        pMem->n = (int)sVar9;
        memmove(pMem->z,pMem->z + 2,sVar9);
        iVar6 = 0;
        pMem->z[pMem->n] = '\0';
        pMem->z[(long)pMem->n + 1] = '\0';
        pbVar1 = (byte *)((long)&pMem->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        pMem->enc = uVar10;
      }
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  i64 n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  i64 nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags;          /* New value for pMem->flags */

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( enc!=0 || n>=0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags= MEM_Str|MEM_Term;
  }else if( enc==0 ){
    flags = MEM_Blob;
    enc = SQLITE_UTF8;
  }else{
    flags = MEM_Str;
  }
  if( nByte>iLimit ){
    if( xDel && xDel!=SQLITE_TRANSIENT ){
      if( xDel==SQLITE_DYNAMIC ){
        sqlite3DbFree(pMem->db, (void*)z);
      }else{
        xDel((void*)z);
      }
    }
    sqlite3VdbeMemSetNull(pMem);
    return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    i64 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = (int)(nByte & 0x7fffffff);
  pMem->flags = flags;
  pMem->enc = enc;

#ifndef SQLITE_OMIT_UTF16
  if( enc>SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif


  return SQLITE_OK;
}